

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

uint8_t * decode_tiles(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,int start_tile,int end_tile)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  CommonTileParams *pCVar5;
  uint8_t *puVar6;
  int in_ECX;
  uint8_t *in_RSI;
  AV1Decoder *in_RDI;
  int in_R8D;
  bool bVar7;
  bool bVar8;
  TileDataDec *tile_data;
  TileBufferDec *tile_bs_buf;
  TileDataDec *tile_data_1;
  int col;
  int row;
  int j;
  uint8_t *raw_data_end;
  uint8_t allow_update_cdf;
  int tile_col;
  int tile_row;
  int inv_row_order;
  int inv_col_order;
  int tile_cols_end;
  int tile_cols_start;
  int tile_rows_end;
  int tile_rows_start;
  int single_col;
  int dec_tile_col;
  int single_row;
  int dec_tile_row;
  TileBufferDec (*tile_buffers) [64];
  int n_tiles;
  int tile_rows;
  int tile_cols;
  CommonTileParams *tiles;
  ThreadData *td;
  AV1_COMMON *cm;
  TileBufferDec (*in_stack_000001c8) [64];
  uint8_t *in_stack_000001d0;
  uint8_t *in_stack_000001d8;
  AV1Decoder *in_stack_000001e0;
  uint in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  aom_internal_error_info *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int iVar9;
  undefined1 in_stack_ffffffffffffff24;
  byte bVar10;
  byte in_stack_ffffffffffffff26;
  byte in_stack_ffffffffffffff27;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int local_c8;
  int local_c4;
  undefined8 in_stack_ffffffffffffff40;
  TileBufferDec (*in_stack_ffffffffffffff48) [64];
  uint8_t *in_stack_ffffffffffffff50;
  TileDataDec *pTVar11;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar12;
  undefined4 in_stack_ffffffffffffff60;
  int tile_row_00;
  undefined4 in_stack_ffffffffffffff64;
  int iVar13;
  uint8_t *local_98;
  int local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  AV1_COMMON *cm_00;
  uint8_t *local_8;
  
  cm_00 = &in_RDI->common;
  pCVar5 = &(in_RDI->common).tiles;
  iVar1 = pCVar5->cols;
  iVar2 = (in_RDI->common).tiles.rows;
  local_c4 = iVar2;
  if (in_RDI->dec_tile_row < iVar2) {
    local_c4 = in_RDI->dec_tile_row;
  }
  bVar7 = -1 < in_RDI->dec_tile_row;
  local_c8 = iVar1;
  if (in_RDI->dec_tile_col < iVar1) {
    local_c8 = in_RDI->dec_tile_col;
  }
  bVar8 = -1 < in_RDI->dec_tile_col;
  local_98 = (uint8_t *)0x0;
  if ((in_RDI->common).tiles.large_scale == 0) {
    local_6c = 0;
    local_74 = 0;
    local_7c = in_RDI->inv_tile_order;
    local_80 = in_RDI->inv_tile_order;
    bVar7 = true;
    local_78 = iVar1;
    local_70 = iVar2;
  }
  else {
    if (bVar7) {
      in_stack_ffffffffffffff30 = local_c4 + 1;
      in_stack_ffffffffffffff34 = local_c4;
    }
    else {
      in_stack_ffffffffffffff34 = 0;
      in_stack_ffffffffffffff30 = iVar2;
    }
    if (bVar8) {
      in_stack_ffffffffffffff28 = local_c8 + 1;
      in_stack_ffffffffffffff2c = local_c8;
    }
    else {
      in_stack_ffffffffffffff2c = 0;
      in_stack_ffffffffffffff28 = iVar1;
    }
    in_stack_ffffffffffffff27 = 0;
    if (in_RDI->inv_tile_order != 0) {
      in_stack_ffffffffffffff27 = bVar8 ^ 0xff;
    }
    local_7c = (uint)(in_stack_ffffffffffffff27 & 1);
    in_stack_ffffffffffffff26 = 0;
    if (in_RDI->inv_tile_order != 0) {
      in_stack_ffffffffffffff26 = bVar7 ^ 0xff;
    }
    local_80 = (uint)(in_stack_ffffffffffffff26 & 1);
    bVar7 = false;
    local_78 = in_stack_ffffffffffffff28;
    local_74 = in_stack_ffffffffffffff2c;
    local_70 = in_stack_ffffffffffffff30;
    local_6c = in_stack_ffffffffffffff34;
  }
  local_8 = in_RSI;
  if ((((local_6c < local_70) && (local_74 < local_78)) &&
      (local_6c * pCVar5->cols + local_74 <= in_R8D)) &&
     (in_ECX <= (local_70 + -1) * pCVar5->cols + local_78 + -1)) {
    bVar10 = 0;
    if (bVar7) {
      bVar10 = (in_RDI->common).features.disable_cdf_update ^ 0xff;
    }
    bVar3 = bVar10 & 1;
    if (((in_RDI->common).tiles.large_scale == 0) || (in_RDI->ext_tile_debug != 0)) {
      if (((in_RDI->common).tiles.large_scale == 0) || (in_RDI->ext_tile_debug == 0)) {
        get_tile_buffers((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                         ,(uint8_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                         (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                         (int)in_stack_ffffffffffffff40);
      }
      else {
        local_98 = get_ls_tile_buffers(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,
                                       in_stack_000001c8);
      }
    }
    else {
      local_98 = get_ls_single_tile_buffer(in_RDI,in_RSI,in_RDI->tile_buffers);
    }
    if ((in_RDI->tile_data == (TileDataDec *)0x0) || (iVar1 * iVar2 != in_RDI->allocated_tiles)) {
      decoder_alloc_tile_data
                ((AV1Decoder *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(in_stack_ffffffffffffff26,
                                   CONCAT15(bVar10,CONCAT14(in_stack_ffffffffffffff24,
                                                            in_stack_ffffffffffffff20)))),
                 in_stack_ffffffffffffff1c);
    }
    if ((in_RDI->dcb).xd.seg_mask == (uint8_t *)0x0) {
      puVar6 = (uint8_t *)
               aom_memalign(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            CONCAT17(in_stack_ffffffffffffff27,
                                     CONCAT16(in_stack_ffffffffffffff26,
                                              CONCAT15(bVar10,CONCAT14(in_stack_ffffffffffffff24,
                                                                       in_stack_ffffffffffffff20))))
                           );
      (in_RDI->dcb).xd.seg_mask = puVar6;
      if ((in_RDI->dcb).xd.seg_mask == (uint8_t *)0x0) {
        aom_internal_error(cm_00->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->dcb.xd.seg_mask");
      }
    }
    set_decode_func_pointers(&in_RDI->td,3);
    memcpy(&in_RDI->td,in_RDI,0x3b60);
    (in_RDI->td).dcb.corrupted = 0;
    (in_RDI->td).dcb.mc_buf[0] = (in_RDI->td).mc_buf[0];
    (in_RDI->td).dcb.mc_buf[1] = (in_RDI->td).mc_buf[1];
    (in_RDI->td).dcb.xd.tmp_conv_dst = (in_RDI->td).tmp_conv_dst;
    for (iVar13 = 0; iVar13 < 2; iVar13 = iVar13 + 1) {
      (in_RDI->td).dcb.xd.tmp_obmc_bufs[iVar13] = (in_RDI->td).tmp_obmc_bufs[iVar13];
    }
    for (local_84 = local_6c; local_84 < local_70; local_84 = local_84 + 1) {
      iVar9 = local_84;
      if (local_80 != 0) {
        iVar9 = (iVar2 + -1) - local_84;
      }
      tile_row_00 = iVar9;
      for (local_88 = local_74; local_88 < local_78; local_88 = local_88 + 1) {
        iVar4 = local_88;
        if (local_7c != 0) {
          iVar4 = (iVar1 + -1) - local_88;
        }
        pTVar11 = in_RDI->tile_data + (long)(tile_row_00 * pCVar5->cols) + (long)iVar4;
        if ((in_ECX <= tile_row_00 * pCVar5->cols + iVar4) &&
           (tile_row_00 * pCVar5->cols + iVar4 <= in_R8D)) {
          (in_RDI->td).bit_reader = &pTVar11->bit_reader;
          iVar12 = iVar4;
          memset(&(in_RDI->td).cb_buffer_base,0,0x30000);
          av1_tile_init((TileInfo *)in_stack_ffffffffffffff10,
                        (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                        0,0x199cfb);
          (in_RDI->td).dcb.xd.current_base_qindex = (cm_00->quant_params).base_qindex;
          in_stack_ffffffffffffff08 = (uint)bVar3;
          setup_bool_decoder((MACROBLOCKD *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             (uint8_t *)
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                             (uint8_t *)
                             CONCAT17(in_stack_ffffffffffffff27,
                                      CONCAT16(in_stack_ffffffffffffff26,
                                               CONCAT15(bVar10,CONCAT14(in_stack_ffffffffffffff24,
                                                                        iVar9)))),
                             CONCAT44(iVar4,in_stack_ffffffffffffff18),in_stack_ffffffffffffff10,
                             (aom_reader *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                             (uint8_t)in_stack_ffffffffffffff40);
          av1_init_macroblockd
                    ((AV1_COMMON *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT15(bVar10,CONCAT14(in_stack_ffffffffffffff24,iVar9)))),
                     (MACROBLOCKD *)CONCAT44(iVar4,in_stack_ffffffffffffff18));
          in_stack_ffffffffffffff10 = (aom_internal_error_info *)&cm_00->above_contexts;
          iVar4 = av1_num_planes(cm_00);
          av1_init_above_context
                    ((CommonContexts *)in_stack_ffffffffffffff10,iVar4,tile_row_00,
                     (MACROBLOCKD *)&in_RDI->td);
          memcpy(&pTVar11->tctx,cm_00->fc,0x52fc);
          (in_RDI->td).dcb.xd.tile_ctx = &pTVar11->tctx;
          decode_tile((AV1Decoder *)CONCAT44(iVar13,tile_row_00),
                      (ThreadData *)CONCAT44(iVar12,in_stack_ffffffffffffff58),
                      (int)((ulong)pTVar11 >> 0x20),(int)pTVar11);
          aom_merge_corrupted_flag(&(in_RDI->dcb).corrupted,(in_RDI->td).dcb.corrupted);
          if ((in_RDI->dcb).corrupted != 0) {
            aom_internal_error(&in_RDI->error,AOM_CODEC_CORRUPT_FRAME,"Failed to decode tile data");
          }
        }
      }
    }
    if ((in_RDI->common).tiles.large_scale == 0) {
      local_8 = aom_reader_find_end(&in_RDI->tile_data[in_R8D].bit_reader);
    }
    else if (iVar1 * iVar2 == 1) {
      local_8 = aom_reader_find_end(&in_RDI->tile_data->bit_reader);
    }
    else {
      local_8 = local_98;
    }
  }
  return local_8;
}

Assistant:

static const uint8_t *decode_tiles(AV1Decoder *pbi, const uint8_t *data,
                                   const uint8_t *data_end, int start_tile,
                                   int end_tile) {
  AV1_COMMON *const cm = &pbi->common;
  ThreadData *const td = &pbi->td;
  CommonTileParams *const tiles = &cm->tiles;
  const int tile_cols = tiles->cols;
  const int tile_rows = tiles->rows;
  const int n_tiles = tile_cols * tile_rows;
  TileBufferDec(*const tile_buffers)[MAX_TILE_COLS] = pbi->tile_buffers;
  const int dec_tile_row = AOMMIN(pbi->dec_tile_row, tile_rows);
  const int single_row = pbi->dec_tile_row >= 0;
  const int dec_tile_col = AOMMIN(pbi->dec_tile_col, tile_cols);
  const int single_col = pbi->dec_tile_col >= 0;
  int tile_rows_start;
  int tile_rows_end;
  int tile_cols_start;
  int tile_cols_end;
  int inv_col_order;
  int inv_row_order;
  int tile_row, tile_col;
  uint8_t allow_update_cdf;
  const uint8_t *raw_data_end = NULL;

  if (tiles->large_scale) {
    tile_rows_start = single_row ? dec_tile_row : 0;
    tile_rows_end = single_row ? dec_tile_row + 1 : tile_rows;
    tile_cols_start = single_col ? dec_tile_col : 0;
    tile_cols_end = single_col ? tile_cols_start + 1 : tile_cols;
    inv_col_order = pbi->inv_tile_order && !single_col;
    inv_row_order = pbi->inv_tile_order && !single_row;
    allow_update_cdf = 0;
  } else {
    tile_rows_start = 0;
    tile_rows_end = tile_rows;
    tile_cols_start = 0;
    tile_cols_end = tile_cols;
    inv_col_order = pbi->inv_tile_order;
    inv_row_order = pbi->inv_tile_order;
    allow_update_cdf = 1;
  }

  // No tiles to decode.
  if (tile_rows_end <= tile_rows_start || tile_cols_end <= tile_cols_start ||
      // First tile is larger than end_tile.
      tile_rows_start * tiles->cols + tile_cols_start > end_tile ||
      // Last tile is smaller than start_tile.
      (tile_rows_end - 1) * tiles->cols + tile_cols_end - 1 < start_tile)
    return data;

  allow_update_cdf = allow_update_cdf && !cm->features.disable_cdf_update;

  assert(tile_rows <= MAX_TILE_ROWS);
  assert(tile_cols <= MAX_TILE_COLS);

#if EXT_TILE_DEBUG
  if (tiles->large_scale && !pbi->ext_tile_debug)
    raw_data_end = get_ls_single_tile_buffer(pbi, data, tile_buffers);
  else if (tiles->large_scale && pbi->ext_tile_debug)
    raw_data_end = get_ls_tile_buffers(pbi, data, data_end, tile_buffers);
  else
#endif  // EXT_TILE_DEBUG
    get_tile_buffers(pbi, data, data_end, tile_buffers, start_tile, end_tile);

  if (pbi->tile_data == NULL || n_tiles != pbi->allocated_tiles) {
    decoder_alloc_tile_data(pbi, n_tiles);
  }
  if (pbi->dcb.xd.seg_mask == NULL)
    CHECK_MEM_ERROR(cm, pbi->dcb.xd.seg_mask,
                    (uint8_t *)aom_memalign(
                        16, 2 * MAX_SB_SQUARE * sizeof(*pbi->dcb.xd.seg_mask)));
#if CONFIG_ACCOUNTING
  if (pbi->acct_enabled) {
    aom_accounting_reset(&pbi->accounting);
  }
#endif

  set_decode_func_pointers(&pbi->td, 0x3);

  // Load all tile information into thread_data.
  td->dcb = pbi->dcb;

  td->dcb.corrupted = 0;
  td->dcb.mc_buf[0] = td->mc_buf[0];
  td->dcb.mc_buf[1] = td->mc_buf[1];
  td->dcb.xd.tmp_conv_dst = td->tmp_conv_dst;
  for (int j = 0; j < 2; ++j) {
    td->dcb.xd.tmp_obmc_bufs[j] = td->tmp_obmc_bufs[j];
  }

  for (tile_row = tile_rows_start; tile_row < tile_rows_end; ++tile_row) {
    const int row = inv_row_order ? tile_rows - 1 - tile_row : tile_row;

    for (tile_col = tile_cols_start; tile_col < tile_cols_end; ++tile_col) {
      const int col = inv_col_order ? tile_cols - 1 - tile_col : tile_col;
      TileDataDec *const tile_data = pbi->tile_data + row * tiles->cols + col;
      const TileBufferDec *const tile_bs_buf = &tile_buffers[row][col];

      if (row * tiles->cols + col < start_tile ||
          row * tiles->cols + col > end_tile)
        continue;

      td->bit_reader = &tile_data->bit_reader;
      av1_zero(td->cb_buffer_base.dqcoeff);
      av1_tile_init(&td->dcb.xd.tile, cm, row, col);
      td->dcb.xd.current_base_qindex = cm->quant_params.base_qindex;
      setup_bool_decoder(&td->dcb.xd, tile_bs_buf->data, data_end,
                         tile_bs_buf->size, &pbi->error, td->bit_reader,
                         allow_update_cdf);
#if CONFIG_ACCOUNTING
      if (pbi->acct_enabled) {
        td->bit_reader->accounting = &pbi->accounting;
        td->bit_reader->accounting->last_tell_frac =
            aom_reader_tell_frac(td->bit_reader);
      } else {
        td->bit_reader->accounting = NULL;
      }
#endif
      av1_init_macroblockd(cm, &td->dcb.xd);
      av1_init_above_context(&cm->above_contexts, av1_num_planes(cm), row,
                             &td->dcb.xd);

      // Initialise the tile context from the frame context
      tile_data->tctx = *cm->fc;
      td->dcb.xd.tile_ctx = &tile_data->tctx;

      // decode tile
      decode_tile(pbi, td, row, col);
      aom_merge_corrupted_flag(&pbi->dcb.corrupted, td->dcb.corrupted);
      if (pbi->dcb.corrupted)
        aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                           "Failed to decode tile data");
    }
  }

  if (tiles->large_scale) {
    if (n_tiles == 1) {
      // Find the end of the single tile buffer
      return aom_reader_find_end(&pbi->tile_data->bit_reader);
    }
    // Return the end of the last tile buffer
    return raw_data_end;
  }
  TileDataDec *const tile_data = pbi->tile_data + end_tile;

  return aom_reader_find_end(&tile_data->bit_reader);
}